

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v8::detail::digit_grouping<char32_t>::next(digit_grouping<char32_t> *this,next_state *state)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  const_reference pvVar4;
  reference pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  next_state *local_20;
  next_state *state_local;
  digit_grouping<char32_t> *this_local;
  
  local_20 = state;
  state_local = (next_state *)this;
  if ((this->sep_).thousands_sep == L'\0') {
    this_local._4_4_ = max_value<int>();
  }
  else {
    local_28._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    bVar2 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&state->group,&local_28);
    if (bVar2) {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)
      ;
      this_local._4_4_ = (int)*pvVar4 + local_20->pos;
      local_20->pos = this_local._4_4_;
    }
    else {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20->group);
      if ('\0' < *pcVar5) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20->group);
        cVar1 = *pcVar5;
        cVar3 = max_value<char>();
        if (cVar1 != cVar3) {
          local_30 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20->group,0);
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_30);
          local_20->pos = (int)*pcVar5 + local_20->pos;
          return local_20->pos;
        }
      }
      this_local._4_4_ = max_value<int>();
    }
  }
  return this_local._4_4_;
}

Assistant:

int next(next_state& state) const {
    if (!sep_.thousands_sep) return max_value<int>();
    if (state.group == sep_.grouping.end())
      return state.pos += sep_.grouping.back();
    if (*state.group <= 0 || *state.group == max_value<char>())
      return max_value<int>();
    state.pos += *state.group++;
    return state.pos;
  }